

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void dateFunc(sqlite3_context *context,int argc,sqlite3_value **argv)

{
  long lVar1;
  int iVar2;
  long in_FS_OFFSET;
  int local_74;
  undefined1 local_70 [4];
  int Y;
  DateTime x;
  sqlite3_value **argv_local;
  int argc_local;
  sqlite3_context *context_local;
  char zBuf [16];
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  x._40_8_ = argv;
  iVar2 = isDate(context,argc,argv,(DateTime *)local_70);
  if (iVar2 == 0) {
    computeYMD((DateTime *)local_70);
    local_74 = (int)x.iJD;
    if ((int)x.iJD < 0) {
      local_74 = -(int)x.iJD;
    }
    context_local._1_1_ =
         (char)((long)((ulong)(uint)((int)((long)local_74 / 1000) >> 0x1f) << 0x20 |
                      (long)local_74 / 1000 & 0xffffffffU) % 10) + '0';
    context_local._2_1_ =
         (char)((long)((ulong)(uint)((int)((long)local_74 / 100) >> 0x1f) << 0x20 |
                      (long)local_74 / 100 & 0xffffffffU) % 10) + '0';
    context_local._3_1_ =
         (char)((long)((ulong)(uint)((int)((long)local_74 / 10) >> 0x1f) << 0x20 |
                      (long)local_74 / 10 & 0xffffffffU) % 10) + '0';
    context_local._4_1_ = (char)(local_74 % 10) + '0';
    context_local._5_1_ = 0x2d;
    context_local._6_1_ =
         (char)((long)((ulong)(uint)((int)((long)x.iJD._4_4_ / 10) >> 0x1f) << 0x20 |
                      (long)x.iJD._4_4_ / 10 & 0xffffffffU) % 10) + '0';
    context_local._7_1_ = (char)(x.iJD._4_4_ % 10) + '0';
    zBuf[0] = '-';
    zBuf[1] = (char)((long)((ulong)(uint)((int)((long)x.Y / 10) >> 0x1f) << 0x20 |
                           (long)x.Y / 10 & 0xffffffffU) % 10) + '0';
    zBuf[2] = (char)(x.Y % 10) + '0';
    zBuf[3] = '\0';
    if ((int)x.iJD < 0) {
      context_local._0_1_ = 0x2d;
      sqlite3_result_text(context,(char *)&context_local,0xb,
                          (_func_void_void_ptr *)0xffffffffffffffff);
    }
    else {
      sqlite3_result_text(context,(char *)((long)&context_local + 1),10,
                          (_func_void_void_ptr *)0xffffffffffffffff);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

static void dateFunc(
  sqlite3_context *context,
  int argc,
  sqlite3_value **argv
){
  DateTime x;
  if( isDate(context, argc, argv, &x)==0 ){
    int Y;
    char zBuf[16];
    computeYMD(&x);
    Y = x.Y;
    if( Y<0 ) Y = -Y;
    zBuf[1] = '0' + (Y/1000)%10;
    zBuf[2] = '0' + (Y/100)%10;
    zBuf[3] = '0' + (Y/10)%10;
    zBuf[4] = '0' + (Y)%10;
    zBuf[5] = '-';
    zBuf[6] = '0' + (x.M/10)%10;
    zBuf[7] = '0' + (x.M)%10;
    zBuf[8] = '-';
    zBuf[9] = '0' + (x.D/10)%10;
    zBuf[10] = '0' + (x.D)%10;
    zBuf[11] = 0;
    if( x.Y<0 ){
      zBuf[0] = '-';
      sqlite3_result_text(context, zBuf, 11, SQLITE_TRANSIENT);
    }else{
      sqlite3_result_text(context, &zBuf[1], 10, SQLITE_TRANSIENT);
    }
  }
}